

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef conv_str_tonum(jit_State *J,TRef tr,TValue *o)

{
  int iVar1;
  TValue *o_local;
  TRef tr_local;
  jit_State *J_local;
  
  o_local._4_4_ = tr;
  if ((tr & 0x1f000000) == 0x4000000) {
    (J->fold).ins.field_0.ot = 0x5e8e;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    (J->fold).ins.field_0.op2 = 0;
    o_local._4_4_ = lj_opt_fold(J);
    iVar1 = lj_strscan_num((GCstr *)(o->u64 & 0x7fffffffffff),o);
    if (iVar1 == 0) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
  }
  return o_local._4_4_;
}

Assistant:

static TRef conv_str_tonum(jit_State *J, TRef tr, TValue *o)
{
  if (tref_isstr(tr)) {
    tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
    /* Would need an inverted STRTO for this rare and useless case. */
    if (!lj_strscan_num(strV(o), o))  /* Convert in-place. Value used below. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);  /* Punt if non-numeric. */
  }
  return tr;
}